

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.hpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::Utils::programLinkageException::~programLinkageException
          (programLinkageException *this)

{
  programLinkageException *this_local;
  
  ~programLinkageException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~programLinkageException() throw()
		{
		}